

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

uint64_t interpolative_internal::read_center_mid(bit_stream *is,uint64_t u)

{
  uint32_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  size_t bits;
  byte bVar4;
  ulong in_RSI;
  uint64_t m;
  uint64_t val;
  unsigned_long_long d;
  unsigned_long_long b;
  size_t in_stack_ffffffffffffffc0;
  bit_stream *this;
  undefined8 local_28;
  
  if (in_RSI == 1) {
    this = (bit_stream *)0x0;
  }
  else {
    uVar1 = ::bits::hi(in_RSI - 1);
    this = (bit_stream *)((ulong)uVar1 + 1);
  }
  bVar4 = (byte)this;
  local_28 = 1;
  if (in_RSI != 1) {
    uVar2 = (1L << (bVar4 & 0x3f)) - in_RSI;
    uVar3 = bit_stream::get_int(this,in_stack_ffffffffffffffc0);
    local_28 = uVar3 + 1;
    if (uVar2 < local_28) {
      bits = local_28 * 2;
      uVar3 = bit_stream::get_int(this,bits);
      local_28 = ((bits + uVar3) - uVar2) - 1;
    }
  }
  local_28 = local_28 + (in_RSI * 2 - (1L << (bVar4 & 0x3f)) >> 1);
  if (in_RSI < local_28) {
    local_28 = local_28 - in_RSI;
  }
  return local_28;
}

Assistant:

static inline uint64_t read_center_mid(bit_stream& is, uint64_t u)
    {
        auto b = u == 1ULL ? 0ULL : bits::hi(u - 1ULL) + 1ULL;
        auto d = 2ULL * u - (1ULL << b);
        uint64_t val = 1ULL;
        if (u != 1) {
            uint64_t m = (1ULL << b) - u;
            val = is.get_int(b - 1) + 1;
            if (val > m) {
                val = (2ULL * val + is.get_int(1)) - m - 1ULL;
            }
        }
        val = val + (d >> 1ULL);
        if (val > u)
            val -= u;
        return val;
    }